

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O0

semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,int,std::less<void>>
          (semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
          *first,int param_4)

{
  owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  local_60;
  owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  local_48;
  int local_2c;
  owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  *poStack_28;
  int min_items_local;
  owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  *last_local;
  owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  *first_local;
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  *local_10;
  
  local_2c = param_4;
  poStack_28 = first;
  last_local = (owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                *)this;
  local_10 = __return_storage_ptr__;
  if (0 < param_4) {
    owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
    ::owning_iterator(&local_48,
                      (owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                       *)this);
    owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
    ::owning_iterator(&local_60,first);
    semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
    ::semiintersect_iterator(__return_storage_ptr__,&local_48,&local_60,(long)local_2c);
    owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
    ::~owning_iterator(&local_60);
    owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
    ::~owning_iterator(&local_48);
    return __return_storage_ptr__;
  }
  __assert_fail("min_items > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                ,0x177,
                "auto burst::make_semiintersect_iterator(RandomAccessIterator, RandomAccessIterator, Integral, Compare) [RandomAccessIterator = burst::owning_iterator<std::vector<boost::iterator_range<const int *>>>, Integral = int, Compare = std::less<void>]"
               );
}

Assistant:

auto
        make_semiintersect_iterator
        (
            RandomAccessIterator first, RandomAccessIterator last,
            Integral min_items,
            Compare compare
        )
    {
        assert(min_items > 0);
        return
            semiintersect_iterator<RandomAccessIterator, Compare>
            (
                std::move(first), std::move(last),
                static_cast<std::size_t>(min_items),
                compare
            );
    }